

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * __thiscall
ON_FontList::FromNames
          (ON_FontList *this,wchar_t *postscript_name,wchar_t *windows_logfont_name,
          wchar_t *family_name,wchar_t *prefered_face_name,Weight prefered_weight,
          Stretch prefered_stretch,Style prefered_style,bool bRequireFaceMatch,
          bool bRequireStyleMatch,bool bUnderlined,bool bStrikethrough,double point_size)

{
  ON_Font *pOVar1;
  bool bMatchUnderlineStrikethroughAndPointSize;
  double point_size_local;
  bool bStrikethrough_local;
  bool bUnderlined_local;
  bool bRequireStyleMatch_local;
  bool bRequireFaceMatch_local;
  Weight prefered_weight_local;
  wchar_t *prefered_face_name_local;
  wchar_t *family_name_local;
  wchar_t *windows_logfont_name_local;
  wchar_t *postscript_name_local;
  ON_FontList *this_local;
  
  pOVar1 = Internal_FromNames(this,postscript_name,windows_logfont_name,family_name,
                              prefered_face_name,prefered_weight,prefered_stretch,prefered_style,
                              bRequireFaceMatch,bRequireStyleMatch,true,bUnderlined,bStrikethrough,
                              point_size);
  return pOVar1;
}

Assistant:

const ON_Font* ON_FontList::FromNames(
  const wchar_t* postscript_name,
  const wchar_t* windows_logfont_name,
  const wchar_t* family_name,
  const wchar_t* prefered_face_name,
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style,
  bool bRequireFaceMatch,
  bool bRequireStyleMatch,
  bool bUnderlined,
  bool bStrikethrough,
  double point_size
) const
{
  bool bMatchUnderlineStrikethroughAndPointSize = true;
  return Internal_FromNames(
    postscript_name,
    windows_logfont_name,
    family_name,
    prefered_face_name,
    prefered_weight,
    prefered_stretch,
    prefered_style,
    bRequireFaceMatch,
    bRequireStyleMatch,
    bMatchUnderlineStrikethroughAndPointSize,
    bUnderlined,
    bStrikethrough,
    point_size
  );
}